

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_ec_keyx.c
# Opt level: O1

int pkey_gost_encrypt(EVP_PKEY_CTX *pctx,uchar *out,size_t *out_len,uchar *key,size_t key_len)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  EVP_PKEY *pEVar6;
  ASN1_OBJECT *pAVar7;
  gost_cipher_info *pgVar8;
  EVP_PKEY *pkey;
  BIGNUM *pBVar9;
  uchar *out_00;
  PSKeyTransport_gost *a;
  ASN1_OCTET_STRING *str;
  EVP_PKEY *pEVar10;
  EC_KEY *pEVar11;
  EC_POINT *pEVar12;
  EC_KEY *pEVar13;
  GOST_KEY_TRANSPORT *a_00;
  int function;
  EVP_PKEY *local_1130;
  uchar *local_1120;
  int local_1118;
  int local_1114;
  uchar ukm [8];
  size_t local_1100;
  uchar shared_key [32];
  uchar crypted_key [44];
  gost_ctx cctx;
  
  pvVar5 = EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)pctx);
  iVar3 = *(int *)((long)pvVar5 + 0x3c);
  if (0x3f4 < iVar3) {
    if ((iVar3 != 0x3f5) && (iVar3 != 0x4a4)) {
LAB_00122adb:
      function = 0x98;
      iVar2 = 0xc0103;
      iVar3 = 0x238;
LAB_00122d66:
      ERR_GOST_error(function,iVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                     ,iVar3);
      return -1;
    }
    crypted_key._0_8_ = out;
    pEVar6 = EVP_PKEY_CTX_get0_pkey((EVP_PKEY_CTX *)pctx);
    pvVar5 = EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)pctx);
    iVar3 = EVP_PKEY_get_base_id(pEVar6);
    shared_key[0] = '\0';
    shared_key[1] = '\0';
    shared_key[2] = '\0';
    shared_key[3] = '\0';
    if (*(int *)((long)pvVar5 + 0x3c) == 0x4a4) {
      local_1100 = 4;
      iVar2 = 8;
      local_1118 = 0x4a8;
    }
    else {
      if (*(int *)((long)pvVar5 + 0x3c) != 0x3f5) {
        function = 0x97;
        iVar2 = 0x86;
        iVar3 = 0x1bb;
        goto LAB_00122d66;
      }
      local_1100 = 8;
      iVar2 = 0x10;
      local_1118 = 0x3f9;
    }
    shared_key._0_4_ = iVar2 + (int)key_len;
    out_00 = (uchar *)CRYPTO_malloc(shared_key._0_4_,
                                    "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                                    ,0x1c0);
    if (out_00 == (uchar *)0x0) {
      function = 0x97;
      iVar2 = 0xc0100;
      iVar3 = 0x1c2;
      goto LAB_00122d66;
    }
    local_1130 = EVP_PKEY_CTX_get0_peerkey((EVP_PKEY_CTX *)pctx);
    if (local_1130 == (EVP_PKEY *)0x0) {
      local_1130 = EVP_PKEY_new();
      if (local_1130 == (EVP_PKEY *)0x0) {
        ERR_GOST_error(0x97,0xc0100,
                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                       ,0x1cb);
        local_1130 = (EVP_PKEY *)0x0;
      }
      else {
        iVar2 = EVP_PKEY_get_base_id(pEVar6);
        pEVar11 = EC_KEY_new();
        iVar2 = EVP_PKEY_assign(local_1130,iVar2,pEVar11);
        if ((iVar2 != 0) && (iVar2 = EVP_PKEY_copy_parameters(local_1130,pEVar6), iVar2 != 0)) {
          pEVar13 = (EC_KEY *)EVP_PKEY_get0(local_1130);
          iVar2 = gost_ec_keygen(pEVar13);
          bVar1 = true;
          if (iVar2 != 0) goto LAB_00122b9c;
        }
        ERR_GOST_error(0x97,0x69,
                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                       ,0x1d3);
      }
      a = (PSKeyTransport_gost *)0x0;
      iVar3 = 0;
      bVar1 = false;
      goto LAB_001232c7;
    }
    bVar1 = false;
LAB_00122b9c:
    if (*(long *)((long)pvVar5 + 0x30) == 0) {
      iVar2 = RAND_bytes((uchar *)((long)pvVar5 + 0x10),0x20);
      if (0 < iVar2) {
        *(undefined8 *)((long)pvVar5 + 0x30) = 0x20;
        goto LAB_00122bc6;
      }
      iVar2 = 0xc0103;
      iVar3 = 0x1db;
LAB_00123123:
      ERR_GOST_error(0x97,iVar2,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                     ,iVar3);
      a = (PSKeyTransport_gost *)0x0;
    }
    else {
LAB_00122bc6:
      pEVar11 = (EC_KEY *)EVP_PKEY_get0(pEVar6);
      pEVar12 = EC_KEY_get0_public_key(pEVar11);
      pEVar13 = (EC_KEY *)EVP_PKEY_get0(local_1130);
      iVar3 = gost_keg((uchar *)((long)pvVar5 + 0x10),iVar3,(EC_POINT *)pEVar12,pEVar13,
                       (uchar *)&cctx);
      if (iVar3 < 1) {
        iVar2 = 0x87;
        iVar3 = 0x1e5;
        goto LAB_00123123;
      }
      iVar3 = gost_kexp15(key,(int)key_len,*(int *)((long)pvVar5 + 0x3c),(uchar *)cctx.key,
                          local_1118,(uchar *)&cctx,(uchar *)((long)pvVar5 + 0x28),local_1100,out_00
                          ,(int *)shared_key);
      if (iVar3 < 1) {
        iVar2 = 0x66;
        iVar3 = 0x1ec;
LAB_0012314d:
        ERR_GOST_error(0x97,iVar2,
                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                       ,iVar3);
        a = (PSKeyTransport_gost *)0x0;
      }
      else {
        a = PSKeyTransport_gost_new();
        if (a == (PSKeyTransport_gost *)0x0) {
          iVar2 = 0xc0100;
          iVar3 = 0x1f2;
          goto LAB_0012314d;
        }
        str = ASN1_OCTET_STRING_new();
        a->ukm = (ASN1_OCTET_STRING *)str;
        if (str == (ASN1_OCTET_STRING *)0x0) {
          iVar2 = 0xc0100;
          iVar3 = 0x1f8;
        }
        else {
          iVar3 = ASN1_OCTET_STRING_set
                            (str,(uchar *)((long)pvVar5 + 0x10),*(int *)((long)pvVar5 + 0x30));
          if (iVar3 == 0) {
            iVar2 = 0xc0100;
            iVar3 = 0x1fd;
          }
          else {
            iVar3 = ASN1_OCTET_STRING_set((ASN1_OCTET_STRING *)a->psexp,out_00,shared_key._0_4_);
            if (iVar3 == 0) {
              iVar2 = 0xc0100;
              iVar3 = 0x202;
            }
            else {
              if (crypted_key._0_8_ != 0) {
                pEVar6 = local_1130;
              }
              iVar3 = X509_PUBKEY_set((X509_PUBKEY **)&a->ephem_key,pEVar6);
              if (iVar3 != 0) {
                iVar3 = 0;
                uVar4 = i2d_PSKeyTransport_gost(a,(uchar **)0x0);
                if ((int)uVar4 < 1) {
                  ERR_GOST_error(0x97,0x8000d,
                                 "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                                 ,0x20d);
                }
                else if (crypted_key._0_8_ == 0) {
                  *out_len = (ulong)uVar4;
                  iVar3 = 1;
                }
                else {
                  if (*out_len < (ulong)uVar4) {
                    iVar2 = 0x8c;
                    iVar3 = 0x216;
                  }
                  else {
                    iVar2 = i2d_PSKeyTransport_gost(a,(uchar **)crypted_key);
                    *out_len = (long)iVar2;
                    iVar3 = 1;
                    if (iVar2 != 0) goto LAB_001232c7;
                    iVar2 = 0x8000d;
                    iVar3 = 0x21c;
                  }
                  ERR_GOST_error(0x97,iVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                                 ,iVar3);
                  iVar3 = 0;
                }
                goto LAB_001232c7;
              }
              iVar2 = 0x66;
              iVar3 = 0x207;
            }
          }
        }
        ERR_GOST_error(0x97,iVar2,
                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                       ,iVar3);
      }
    }
    iVar3 = 0;
LAB_001232c7:
    OPENSSL_cleanse(&cctx,0x40);
    if (bVar1) {
      EVP_PKEY_free(local_1130);
    }
    PSKeyTransport_gost_free(a);
    CRYPTO_free(out_00);
    return iVar3;
  }
  if ((iVar3 != 0) && (iVar3 != 0x32d)) goto LAB_00122adb;
  local_1120 = out;
  pEVar6 = EVP_PKEY_CTX_get0_pkey((EVP_PKEY_CTX *)pctx);
  pvVar5 = EVP_PKEY_CTX_get_data((EVP_PKEY_CTX *)pctx);
  iVar2 = EVP_PKEY_get_base_id(pEVar6);
  iVar3 = 0x3eb;
  if (iVar2 == 0x32b) {
    iVar3 = 0x338;
  }
  if (iVar2 == 0x331) {
    iVar3 = 0x338;
  }
  pAVar7 = OBJ_nid2obj(iVar3);
  pgVar8 = get_encryption_params((ASN1_OBJECT *)pAVar7);
  pkey = EVP_PKEY_CTX_get0_peerkey((EVP_PKEY_CTX *)pctx);
  if (*(long *)((long)pvVar5 + 0x30) == 0) {
    iVar3 = RAND_bytes(ukm,8);
    if (iVar3 < 1) {
      ERR_GOST_error(0x7c,0x7e,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                     ,0x12d);
      return 0;
    }
  }
  else {
    ukm = *(uchar (*) [8])((long)pvVar5 + 0x10);
  }
  if (pgVar8 == (gost_cipher_info *)0x0) {
    a_00 = (GOST_KEY_TRANSPORT *)0x0;
LAB_00122d46:
    bVar1 = true;
    pEVar10 = pkey;
  }
  else {
    if (pkey == (EVP_PKEY *)0x0) {
      bVar1 = true;
      if (local_1120 != (uchar *)0x0) {
        pEVar10 = EVP_PKEY_new();
        iVar3 = EVP_PKEY_get_base_id(pEVar6);
        pEVar11 = EC_KEY_new();
        iVar3 = EVP_PKEY_assign(pEVar10,iVar3,pEVar11);
        if ((iVar3 != 0) && (iVar3 = EVP_PKEY_copy_parameters(pEVar10,pEVar6), iVar3 != 0)) {
          pEVar13 = (EC_KEY *)EVP_PKEY_get0(pEVar10);
          iVar3 = gost_ec_keygen(pEVar13);
          if (iVar3 != 0) goto LAB_00122f0d;
        }
        ERR_GOST_error(0x7c,0x69,
                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                       ,0x143);
        bVar1 = true;
        a_00 = (GOST_KEY_TRANSPORT *)0x0;
        goto LAB_00123082;
      }
      pEVar10 = (EVP_PKEY *)0x0;
    }
    else {
      pBVar9 = gost_get0_priv_key((EVP_PKEY *)pkey);
      pEVar10 = pkey;
      if (pBVar9 == (BIGNUM *)0x0) {
        ERR_GOST_error(0x7c,0x7c,
                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                       ,0x138);
        a_00 = (GOST_KEY_TRANSPORT *)0x0;
        bVar1 = false;
        goto LAB_00123082;
      }
      bVar1 = false;
    }
LAB_00122f0d:
    if (local_1120 == (uchar *)0x0) {
LAB_00122fe8:
      a_00 = GOST_KEY_TRANSPORT_new();
      if (a_00 != (GOST_KEY_TRANSPORT *)0x0) {
        iVar3 = ASN1_OCTET_STRING_set((ASN1_OCTET_STRING *)a_00->key_agreement_info->eph_iv,ukm,8);
        if (((iVar3 == 0) ||
            (iVar3 = ASN1_OCTET_STRING_set
                               ((ASN1_OCTET_STRING *)a_00->key_info->imit,crypted_key + 0x28,4),
            iVar3 == 0)) ||
           (iVar3 = ASN1_OCTET_STRING_set
                              ((ASN1_OCTET_STRING *)a_00->key_info->encrypted_key,crypted_key + 8,
                               0x20), iVar3 == 0)) goto LAB_00123082;
        if (pkey == (EVP_PKEY *)0x0) {
          if (local_1120 != (uchar *)0x0) {
            pEVar6 = pEVar10;
          }
          iVar3 = X509_PUBKEY_set((X509_PUBKEY **)&a_00->key_agreement_info->ephem_key,pEVar6);
          if (iVar3 == 0) {
            ERR_GOST_error(0x7c,0x66,
                           "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                           ,0x16a);
            pkey = pEVar10;
            goto LAB_00122d46;
          }
          ASN1_OBJECT_free((ASN1_OBJECT *)a_00->key_agreement_info->cipher);
          pAVar7 = OBJ_nid2obj(pgVar8->nid);
          a_00->key_agreement_info->cipher = (ASN1_OBJECT *)pAVar7;
          EVP_PKEY_free(pEVar10);
        }
        else {
          ASN1_OBJECT_free((ASN1_OBJECT *)a_00->key_agreement_info->cipher);
          pAVar7 = OBJ_nid2obj(pgVar8->nid);
          a_00->key_agreement_info->cipher = (ASN1_OBJECT *)pAVar7;
        }
        if (pkey != (EVP_PKEY *)0x0) {
          iVar3 = EVP_PKEY_CTX_ctrl((EVP_PKEY_CTX *)pctx,-1,-1,2,3,(void *)0x0);
          if (iVar3 < 1) {
            ERR_GOST_error(0x7c,0x68,
                           "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                           ,0x176);
            bVar1 = false;
            goto LAB_00123082;
          }
        }
        uVar4 = i2d_GOST_KEY_TRANSPORT(a_00,(uchar **)0x0);
        if ((int)uVar4 < 1) {
          iVar2 = 0x8000d;
          iVar3 = 0x17c;
        }
        else {
          if (local_1120 == (uchar *)0x0) {
            *out_len = (ulong)uVar4;
            iVar3 = 1;
LAB_00123362:
            OPENSSL_cleanse(shared_key,0x20);
            GOST_KEY_TRANSPORT_free(a_00);
            return iVar3;
          }
          if ((ulong)uVar4 <= *out_len) {
            iVar2 = i2d_GOST_KEY_TRANSPORT(a_00,&local_1120);
            *out_len = (long)iVar2;
            iVar3 = 1;
            if (iVar2 == 0) {
              ERR_GOST_error(0x7c,0x8000d,
                             "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                             ,0x18b);
              iVar3 = 0;
            }
            goto LAB_00123362;
          }
          iVar2 = 0x8c;
          iVar3 = 0x185;
        }
        ERR_GOST_error(0x7c,iVar2,
                       "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                       ,iVar3);
        goto LAB_00123082;
      }
    }
    else {
      local_1114 = 0;
      EVP_PKEY_get_default_digest_nid(pEVar6,&local_1114);
      if (local_1114 == 0x3d7) {
        local_1114 = 0x3d6;
      }
      pEVar11 = (EC_KEY *)EVP_PKEY_get0(pEVar6);
      pEVar12 = EC_KEY_get0_public_key(pEVar11);
      pEVar13 = (EC_KEY *)EVP_PKEY_get0(pEVar10);
      iVar3 = VKO_compute_key(shared_key,(EC_POINT *)pEVar12,pEVar13,ukm,8,local_1114);
      if (iVar3 != 0) {
        gost_init(&cctx,pgVar8->sblock);
        keyWrapCryptoPro(&cctx,shared_key,ukm,key,crypted_key);
        goto LAB_00122fe8;
      }
      ERR_GOST_error(0x7c,0x69,
                     "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_ec_keyx.c"
                     ,0x152);
    }
    a_00 = (GOST_KEY_TRANSPORT *)0x0;
  }
LAB_00123082:
  OPENSSL_cleanse(shared_key,0x20);
  if (bVar1) {
    EVP_PKEY_free(pEVar10);
  }
  GOST_KEY_TRANSPORT_free(a_00);
  return -1;
}

Assistant:

int pkey_gost_encrypt(EVP_PKEY_CTX *pctx, unsigned char *out,
                      size_t *out_len, const unsigned char *key, size_t key_len)
{
  struct gost_pmeth_data *gctx = EVP_PKEY_CTX_get_data(pctx);
  switch (gctx->cipher_nid)
  {
    case NID_id_Gost28147_89:
    case NID_undef: /* FIXME */
      return pkey_GOST_ECcp_encrypt(pctx, out, out_len, key, key_len);
      break;
    case NID_kuznyechik_ctr:
    case NID_magma_ctr:
      return pkey_gost2018_encrypt(pctx, out, out_len, key, key_len);
      break;
    default:
      GOSTerr(GOST_F_PKEY_GOST_ENCRYPT, ERR_R_INTERNAL_ERROR);
      return -1;
  }
}